

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
Parser::printError<unsigned_long,unsigned_long>
          (Parser *this,Token *token,char *text,unsigned_long *args,unsigned_long *args_1)

{
  string local_50;
  unsigned_long *local_30;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  char *text_local;
  Token *token_local;
  Parser *this_local;
  
  local_30 = args_1;
  args_local_1 = args;
  args_local = (unsigned_long *)text;
  text_local = (char *)token;
  token_local = (Token *)this;
  tinyformat::format<unsigned_long,unsigned_long>
            (&local_50,(tinyformat *)text,(char *)args,args_1,args_1);
  printError(this,token,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}